

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.cpp
# Opt level: O1

void anon_unknown.dwarf_3a15::printTestError
               (string *testName,size_t max1,size_t max2,size_t i,size_t res)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in test \"",0xf);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(testName->_M_dataplus)._M_p,testName->_M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"max: ",5);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," x ",3);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"i = ",4);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"test = ",7);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void printTestError(const string& testName, size_t max1, size_t max2, size_t i, size_t res) {
    cerr << "Error in test \"" << testName << "\"" << endl;
    cerr << "max: " << max1 << " x " << max2 << endl;
    cerr << "i = " << i << endl;
    cerr << "test = " << res << endl;
}